

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::BeginElemSegment
          (BinaryReaderIR *this,Index index,Index table_index,uint8_t flags)

{
  Module *this_00;
  pointer pEVar1;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_c8;
  Location local_c0;
  Var local_a0;
  ElemSegment *local_58;
  ElemSegment *elem_segment;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_30;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_> field
  ;
  uint8_t flags_local;
  Index table_index_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl._7_1_ = flags;
  GetLocation((Location *)&elem_segment,this);
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location>
            ((wabt *)&local_30,(Location *)&elem_segment);
  pEVar1 = std::
           unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
           ::operator->(&local_30);
  local_58 = &pEVar1->elem_segment;
  GetLocation(&local_c0,this);
  Var::Var(&local_a0,table_index,&local_c0);
  Var::operator=(&local_58->table_var,&local_a0);
  Var::~Var(&local_a0);
  if ((field._M_t.
       super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
       .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl._7_1_ & 3) == 3) {
    local_58->kind = Declared;
  }
  else if ((field._M_t.
            super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
            .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl._7_1_ & 1) ==
           1) {
    local_58->kind = Passive;
  }
  else {
    local_58->kind = Active;
  }
  this_00 = this->module_;
  std::unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ::unique_ptr(&local_c8,&local_30);
  Module::AppendField(this_00,&local_c8);
  std::unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ::~unique_ptr(&local_c8);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ::~unique_ptr(&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::BeginElemSegment(Index index,
                                        Index table_index,
                                        uint8_t flags) {
  auto field = MakeUnique<ElemSegmentModuleField>(GetLocation());
  ElemSegment& elem_segment = field->elem_segment;
  elem_segment.table_var = Var(table_index, GetLocation());
  if ((flags & SegDeclared) == SegDeclared) {
    elem_segment.kind = SegmentKind::Declared;
  } else if ((flags & SegPassive) == SegPassive) {
    elem_segment.kind = SegmentKind::Passive;
  } else {
    elem_segment.kind = SegmentKind::Active;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}